

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalUngroupedAggregate::Combine
          (PhysicalUngroupedAggregate *this,ExecutionContext *context,
          OperatorSinkCombineInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  QueryProfiler *this_00;
  OperatorSinkCombineInput distinct_input;
  OperatorSinkCombineInput local_38;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  local_38.interrupt_state = input->interrupt_state;
  local_38.global_state = pGVar1;
  local_38.local_state = pLVar2;
  CombineDistinct(this,context,&local_38);
  GlobalUngroupedAggregateState::Combine
            ((GlobalUngroupedAggregateState *)(pGVar1 + 1),
             (LocalUngroupedAggregateState *)(pLVar2 + 1));
  this_00 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,&this->super_PhysicalOperator);
  QueryProfiler::Flush(this_00,&context->thread->profiler);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalUngroupedAggregate::Combine(ExecutionContext &context,
                                                          OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<UngroupedAggregateGlobalSinkState>();
	auto &lstate = input.local_state.Cast<UngroupedAggregateLocalSinkState>();
	D_ASSERT(!gstate.finished);

	// finalize: combine the local state into the global state
	// all aggregates are combinable: we might be doing a parallel aggregate
	// use the combine method to combine the partial aggregates
	OperatorSinkCombineInput distinct_input {gstate, lstate, input.interrupt_state};
	CombineDistinct(context, distinct_input);

	gstate.state.Combine(lstate.state);

	auto &client_profiler = QueryProfiler::Get(context.client);
	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);

	return SinkCombineResultType::FINISHED;
}